

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_string_primitive_withoutSuffix
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  ulong __n;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = *arguments;
  uVar2 = arguments[1];
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    __n = (ulong)*(uint *)(uVar2 + 0xc);
    if (__n != 0) {
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        uVar5 = (ulong)*(uint *)(uVar1 + 0xc);
      }
      else {
        uVar5 = 0;
      }
      if (*(uint *)(uVar2 + 0xc) <= (uint)uVar5) {
        iVar3 = bcmp((void *)((uVar1 + uVar5 + 0x10) - __n),(void *)(uVar2 + 0x10),__n);
        if (iVar3 == 0) {
          sVar4 = sysbvm_string_createWithString(context,uVar5 - __n,(char *)(uVar1 + 0x10));
          return sVar4;
        }
      }
    }
  }
  return uVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_string_primitive_withoutSuffix(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t string = arguments[0];
    sysbvm_tuple_t suffix = arguments[1];

    size_t suffixLen = sysbvm_tuple_getSizeInBytes(suffix);
    if(suffixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    if(stringSize < suffixLen)
        return string;
    
    uint8_t *suffixData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(suffix)->bytes;
    uint8_t *stringData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes;
    if(memcmp(stringData + stringSize - suffixLen, suffixData, suffixLen))
        return string;

    return sysbvm_string_createWithString(context, stringSize - suffixLen, (const char*)(stringData));
}